

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjSaveImage(char *filename,uchar *buffer,int width,int pitch,int height,int pixelFormat,
               int flags)

{
  long lVar1;
  int iVar2;
  FILE *handle;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  djpeg_dest_ptr pdVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char **cinfo;
  long *in_FS_OFFSET;
  
  if ((height < 1 ||
      ((pitch < 0 || width < 1) || (buffer == (uchar *)0x0 || filename == (char *)0x0))) ||
      0xb < (uint)pixelFormat) {
    in_FS_OFFSET[-0x18] = 0x612064696c61766e;
    in_FS_OFFSET[-0x17] = 0x746e656d756772;
    in_FS_OFFSET[-0x1a] = 0x6d49657661536a74;
    in_FS_OFFSET[-0x19] = 0x49203a2928656761;
    iVar2 = -1;
    __stream = (FILE *)0x0;
    handle = __stream;
    goto LAB_0010ff31;
  }
  handle = (FILE *)tjInitDecompress();
  if (handle == (FILE *)0x0) {
    return -1;
  }
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    lVar1 = *in_FS_OFFSET;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    snprintf((char *)(lVar1 + -0xd0),200,"%s\n%s","tjSaveImage(): Cannot open output file",pcVar4);
    iVar2 = -1;
    __stream = (FILE *)0x0;
    goto LAB_0010ff31;
  }
  iVar2 = _setjmp((__jmp_buf_tag *)&handle[6]._IO_read_base);
  if (iVar2 != 0) {
    iVar2 = -1;
    goto LAB_0010ff31;
  }
  cinfo = &handle[2]._IO_save_end;
  *(J_COLOR_SPACE *)&handle[2].__pad1 = pf2cs[(uint)pixelFormat];
  *(int *)&handle[2]._lock = width;
  *(int *)((long)&handle[2]._lock + 4) = height;
  *(undefined4 *)((long)&handle[2]._old_offset + 4) = 0xca;
  *(undefined8 *)((long)&handle[2].__pad1 + 4) = 0x100000001;
  pcVar4 = strrchr(filename,0x2e);
  if ((pcVar4 == (char *)0x0) || (iVar2 = strcasecmp(pcVar4,".bmp"), iVar2 != 0)) {
    pdVar5 = jinit_write_ppm((j_decompress_ptr)cinfo);
    if (pdVar5 == (djpeg_dest_ptr)0x0) {
      builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"lize PPM",8);
      builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9)," writer",8);
      in_FS_OFFSET[-0x18] = 0x746f6e20646c756f;
      in_FS_OFFSET[-0x17] = 0x6c616974696e6920;
      in_FS_OFFSET[-0x1a] = 0x6d49657661536a74;
      in_FS_OFFSET[-0x19] = 0x43203a2928656761;
      goto LAB_0010ff24;
    }
    uVar6 = (uint)flags >> 1 & 1;
  }
  else {
    pdVar5 = jinit_write_bmp((j_decompress_ptr)cinfo,0,0);
    if (pdVar5 == (djpeg_dest_ptr)0x0) {
      in_FS_OFFSET[-0x16] = 0x6d74696220657a69;
      in_FS_OFFSET[-0x15] = 0x6574697277207061;
      in_FS_OFFSET[-0x18] = 0x746f6e20646c756f;
      in_FS_OFFSET[-0x17] = 0x6c616974696e6920;
      in_FS_OFFSET[-0x1a] = 0x6d49657661536a74;
      in_FS_OFFSET[-0x19] = 0x43203a2928656761;
      *(undefined2 *)(in_FS_OFFSET + -0x14) = 0x72;
LAB_0010ff24:
      iVar2 = -1;
      goto LAB_0010ff31;
    }
    uVar6 = (uint)((flags & 2U) == 0);
  }
  pdVar5->output_file = (FILE *)__stream;
  (*pdVar5->start_output)((j_decompress_ptr)cinfo,pdVar5);
  (*(code *)handle[2]._markers[2]._next)(cinfo);
  if (pitch == 0) {
    pitch = tjPixelSize[(uint)pixelFormat] * width;
  }
  uVar8 = *(uint *)&handle[3]._IO_write_ptr;
  if (uVar8 < *(uint *)((long)&handle[3]._IO_read_ptr + 4)) {
    iVar2 = tjPixelSize[(uint)pixelFormat];
    do {
      uVar7 = ~uVar8 + height;
      if (uVar6 == 0) {
        uVar7 = uVar8;
      }
      memcpy(*pdVar5->buffer,buffer + uVar7 * pitch,(long)width * (long)iVar2);
      (*pdVar5->put_pixel_rows)((j_decompress_ptr)cinfo,pdVar5,1);
      uVar8 = *(int *)&handle[3]._IO_write_ptr + 1;
      *(uint *)&handle[3]._IO_write_ptr = uVar8;
    } while (uVar8 < *(uint *)((long)&handle[3]._IO_read_ptr + 4));
  }
  (*pdVar5->finish_output)((j_decompress_ptr)cinfo,pdVar5);
  iVar2 = 0;
LAB_0010ff31:
  if (handle != (FILE *)0x0) {
    tjDestroy(handle);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return iVar2;
}

Assistant:

DLLEXPORT int tjSaveImage(const char *filename, unsigned char *buffer,
                          int width, int pitch, int height, int pixelFormat,
                          int flags)
{
  int retval = 0;
  tjhandle handle = NULL;
  tjinstance *this;
  j_decompress_ptr dinfo = NULL;
  djpeg_dest_ptr dst;
  FILE *file = NULL;
  char *ptr = NULL;
  boolean invert;

  if (!filename || !buffer || width < 1 || pitch < 0 || height < 1 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROWG("tjSaveImage(): Invalid argument");

  if ((handle = tjInitDecompress()) == NULL)
    return -1;
  this = (tjinstance *)handle;
  dinfo = &this->dinfo;

  if ((file = fopen(filename, "wb")) == NULL)
    THROW_UNIX("tjSaveImage(): Cannot open output file");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  this->dinfo.out_color_space = pf2cs[pixelFormat];
  dinfo->image_width = width;  dinfo->image_height = height;
  dinfo->global_state = DSTATE_READY;
  dinfo->scale_num = dinfo->scale_denom = 1;

  ptr = strrchr(filename, '.');
  if (ptr && !strcasecmp(ptr, ".bmp")) {
    if ((dst = jinit_write_bmp(dinfo, FALSE, FALSE)) == NULL)
      THROWG("tjSaveImage(): Could not initialize bitmap writer");
    invert = (flags & TJFLAG_BOTTOMUP) == 0;
  } else {
    if ((dst = jinit_write_ppm(dinfo)) == NULL)
      THROWG("tjSaveImage(): Could not initialize PPM writer");
    invert = (flags & TJFLAG_BOTTOMUP) != 0;
  }

  dst->output_file = file;
  (*dst->start_output) (dinfo, dst);
  (*dinfo->mem->realize_virt_arrays) ((j_common_ptr)dinfo);

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  while (dinfo->output_scanline < dinfo->output_height) {
    unsigned char *rowptr;

    if (invert)
      rowptr = &buffer[(height - dinfo->output_scanline - 1) * pitch];
    else
      rowptr = &buffer[dinfo->output_scanline * pitch];
    memcpy(dst->buffer[0], rowptr, width * tjPixelSize[pixelFormat]);
    (*dst->put_pixel_rows) (dinfo, dst, 1);
    dinfo->output_scanline++;
  }

  (*dst->finish_output) (dinfo, dst);

bailout:
  if (handle) tjDestroy(handle);
  if (file) fclose(file);
  return retval;
}